

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O2

bool bssl::add_new_session_tickets(SSL_HANDSHAKE *hs,bool *out_sent_tickets)

{
  SSL *ssl;
  UniquePtr<SSL_SESSION> this;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint16_t value;
  uint32_t uVar5;
  int iVar6;
  size_t sVar7;
  undefined1 in_R8B;
  ulong uVar8;
  Span<const_unsigned_char> nonce_00;
  uint8_t nonce [1];
  UniquePtr<SSL_SESSION> session;
  CBB extensions;
  CBB body;
  ScopedCBB cbb;
  CBB ticket;
  CBB nonce_cbb;
  CBB early_data;
  
  if ((hs->field_0x6c8 & 0x10) != 0) {
    ssl = hs->ssl;
    uVar5 = SSL_get_options(ssl);
    if (((uVar5 >> 0xe & 1) == 0) &&
       ((hs->pake_verifier)._M_t.
        super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl == (Verifier *)0x0))
    {
      ssl_session_rebase_time
                (ssl,(hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      bVar1 = ((ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->num_tickets;
      if (0x10 < bVar1) {
        __assert_fail("ssl->session_ctx->num_tickets <= kMaxTickets",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                      ,0xaa,"bool bssl::add_new_session_tickets(SSL_HANDSHAKE *, bool *)");
      }
      bVar3 = false;
      uVar8 = 0;
      while( true ) {
        if (bVar1 <= uVar8) {
          *out_sent_tickets = bVar3;
          return true;
        }
        SSL_SESSION_dup((bssl *)&session,
                        (hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,2);
        if (((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
             session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) ||
           (iVar6 = RAND_bytes((uchar *)((long)session._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 0x180),4), iVar6 == 0))
        goto LAB_0016351d;
        *(byte *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
             *(byte *)((long)session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) |
             8;
        if (((ssl->field_0xa4 & 4) == 0) ||
           (((iVar6 = SSL_is_quic(ssl), iVar6 != 0 &&
             ((((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
              quic_early_data_context).size_ == 0)) || (iVar6 = SSL_is_dtls(ssl), iVar6 != 0)))) {
          bVar4 = false;
        }
        else {
          iVar6 = SSL_is_quic(ssl);
          *(uint *)((long)session._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x184) =
               -(uint)(iVar6 != 0) | 0x3800;
          bVar4 = true;
        }
        *(byte *)((long)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) =
             *(byte *)((long)session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 0x1b8) &
             0x7f | (ssl->field_0xa4 & 8) << 4;
        nonce[0] = (uint8_t)uVar8;
        CBB_zero(&cbb.ctx_);
        bVar2 = (*ssl->method->init_message)(ssl,&cbb.ctx_,&body,'\x04');
        if (((!bVar2) ||
            (iVar6 = CBB_add_u32(&body,*(uint32_t *)
                                        ((long)session._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 200)), iVar6 == 0)) ||
           ((iVar6 = CBB_add_u32(&body,*(uint32_t *)
                                        ((long)session._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 0x180)), iVar6 == 0 ||
            ((iVar6 = CBB_add_u8_length_prefixed(&body,&nonce_cbb), iVar6 == 0 ||
             (iVar6 = CBB_add_bytes(&nonce_cbb,nonce,1), this = session, iVar6 == 0)))))) break;
        iVar6 = SSL_is_dtls(ssl);
        nonce_00.size_._0_1_ = iVar6 != 0;
        nonce_00.data_ = (uchar *)0x1;
        nonce_00.size_._1_7_ = 0;
        bVar2 = tls13_derive_session_psk
                          ((bssl *)this._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                           (SSL_SESSION *)nonce,nonce_00,(bool)in_R8B);
        if ((!bVar2) ||
           ((iVar6 = CBB_add_u16_length_prefixed(&body,&ticket), iVar6 == 0 ||
            (bVar2 = ssl_encrypt_ticket(hs,&ticket,
                                        (SSL_SESSION *)
                                        session._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                       ), !bVar2)))) break;
        sVar7 = CBB_len(&ticket);
        if (sVar7 != 0) {
          iVar6 = CBB_add_u16_length_prefixed(&body,&extensions);
          if (iVar6 != 0) {
            if (bVar4) {
              iVar6 = CBB_add_u16(&extensions,0x2a);
              if ((((iVar6 == 0) ||
                   (iVar6 = CBB_add_u16_length_prefixed(&extensions,&early_data), iVar6 == 0)) ||
                  (iVar6 = CBB_add_u32(&early_data,
                                       *(uint32_t *)
                                        ((long)session._M_t.
                                               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                               _M_head_impl + 0x184)), iVar6 == 0)) ||
                 (iVar6 = CBB_flush(&extensions), iVar6 == 0)) break;
            }
            bVar3 = ssl_add_flags_extension
                              (&extensions,
                               (*(byte *)((long)session._M_t.
                                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_ssl_session_st_*,_false>.
                                                _M_head_impl + 0x1b8) & 0xffffff80) * 2);
            if (bVar3) {
              value = ssl_get_grease_value(hs,ssl_grease_ticket_extension);
              iVar6 = CBB_add_u16(&extensions,value);
              if ((iVar6 != 0) && (iVar6 = CBB_add_u16(&extensions,0), iVar6 != 0)) {
                bVar4 = ssl_add_message_cbb(ssl,&cbb.ctx_);
                bVar3 = true;
                if (bVar4) goto LAB_001634c0;
              }
            }
          }
          break;
        }
LAB_001634c0:
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&session);
        uVar8 = uVar8 + 1;
        bVar1 = ((ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->num_tickets;
      }
      internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
LAB_0016351d:
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session);
      return false;
    }
  }
  *out_sent_tickets = false;
  return true;
}

Assistant:

static bool add_new_session_tickets(SSL_HANDSHAKE *hs, bool *out_sent_tickets) {
  SSL *const ssl = hs->ssl;
  if (  // If the client doesn't accept resumption with PSK_DHE_KE, don't send a
        // session ticket.
      !hs->accept_psk_mode ||
      // We only implement stateless resumption in TLS 1.3, so skip sending
      // tickets if disabled.
      (SSL_get_options(ssl) & SSL_OP_NO_TICKET) ||
      // Don't send tickets for PAKE connections. We don't support resumption
      // with PAKEs.
      hs->pake_verifier != nullptr) {
    *out_sent_tickets = false;
    return true;
  }

  // Rebase the session timestamp so that it is measured from ticket
  // issuance.
  ssl_session_rebase_time(ssl, hs->new_session.get());

  assert(ssl->session_ctx->num_tickets <= kMaxTickets);
  bool sent_tickets = false;
  for (size_t i = 0; i < ssl->session_ctx->num_tickets; i++) {
    UniquePtr<SSL_SESSION> session(
        SSL_SESSION_dup(hs->new_session.get(), SSL_SESSION_INCLUDE_NONAUTH));
    if (!session) {
      return false;
    }

    if (!RAND_bytes((uint8_t *)&session->ticket_age_add, 4)) {
      return false;
    }
    session->ticket_age_add_valid = true;
    // TODO(crbug.com/381113363): Remove the SSL_is_dtls check once we support
    // 0-RTT for DTLS 1.3.
    bool enable_early_data =
        ssl->enable_early_data &&
        (!SSL_is_quic(ssl) || !ssl->config->quic_early_data_context.empty()) &&
        !SSL_is_dtls(ssl);
    if (enable_early_data) {
      // QUIC does not use the max_early_data_size parameter and always sets it
      // to a fixed value. See RFC 9001, section 4.6.1.
      session->ticket_max_early_data =
          SSL_is_quic(ssl) ? 0xffffffff : kMaxEarlyDataAccepted;
    }
    session->is_resumable_across_names = ssl->resumption_across_names_enabled;

    static_assert(kMaxTickets < 256, "Too many tickets");
    assert(i < 256);
    uint8_t nonce[] = {static_cast<uint8_t>(i)};

    ScopedCBB cbb;
    CBB body, nonce_cbb, ticket, extensions;
    if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                   SSL3_MT_NEW_SESSION_TICKET) ||
        !CBB_add_u32(&body, session->timeout) ||
        !CBB_add_u32(&body, session->ticket_age_add) ||
        !CBB_add_u8_length_prefixed(&body, &nonce_cbb) ||
        !CBB_add_bytes(&nonce_cbb, nonce, sizeof(nonce)) ||
        !tls13_derive_session_psk(session.get(), nonce, SSL_is_dtls(ssl)) ||
        !CBB_add_u16_length_prefixed(&body, &ticket) ||
        !ssl_encrypt_ticket(hs, &ticket, session.get())) {
      return false;
    }

    if (CBB_len(&ticket) == 0) {
      // The caller decided not to encrypt a ticket. Skip the message.
      continue;
    }

    if (!CBB_add_u16_length_prefixed(&body, &extensions)) {
      return false;
    }

    if (enable_early_data) {
      CBB early_data;
      if (!CBB_add_u16(&extensions, TLSEXT_TYPE_early_data) ||
          !CBB_add_u16_length_prefixed(&extensions, &early_data) ||
          !CBB_add_u32(&early_data, session->ticket_max_early_data) ||
          !CBB_flush(&extensions)) {
        return false;
      }
    }

    SSLFlags flags = 0;
    if (session->is_resumable_across_names) {
      flags |= kSSLFlagResumptionAcrossNames;
    }
    if (!ssl_add_flags_extension(&extensions, flags)) {
      return false;
    }

    // Add a fake extension. See RFC 8701.
    if (!CBB_add_u16(&extensions,
                     ssl_get_grease_value(hs, ssl_grease_ticket_extension)) ||
        !CBB_add_u16(&extensions, 0 /* empty */)) {
      return false;
    }

    if (!ssl_add_message_cbb(ssl, cbb.get())) {
      return false;
    }
    sent_tickets = true;
  }

  *out_sent_tickets = sent_tickets;
  return true;
}